

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuList.c
# Opt level: O3

void Fxu_ListVarDelLiteral(Fxu_Var *pVar,Fxu_Lit *pLink)

{
  int *piVar1;
  Fxu_Lit *pFVar2;
  Fxu_Lit *pFVar3;
  
  if ((pVar->lLits).pHead == pLink) {
    (pVar->lLits).pHead = pLink->pVNext;
  }
  pFVar2 = pLink->pVPrev;
  if ((pVar->lLits).pTail == pLink) {
    (pVar->lLits).pTail = pFVar2;
  }
  pFVar3 = pLink->pVNext;
  if (pFVar2 != (Fxu_Lit *)0x0) {
    pFVar2->pVNext = pFVar3;
  }
  if (pFVar3 != (Fxu_Lit *)0x0) {
    pFVar3->pVPrev = pFVar2;
  }
  piVar1 = &(pVar->lLits).nItems;
  *piVar1 = *piVar1 + -1;
  return;
}

Assistant:

void Fxu_ListVarDelLiteral( Fxu_Var * pVar, Fxu_Lit * pLink )
{
	Fxu_ListLit * pList = &(pVar->lLits);
	if ( pList->pHead == pLink )
		 pList->pHead = pLink->pVNext;
	if ( pList->pTail == pLink )
		 pList->pTail = pLink->pVPrev;
	if ( pLink->pVPrev )
		 pLink->pVPrev->pVNext = pLink->pVNext;
	if ( pLink->pVNext )
		 pLink->pVNext->pVPrev = pLink->pVPrev;
	pList->nItems--;
}